

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::wm_slot*,std::allocator<xray_re::wm_slot*>>,write_wm_slot>
          (xr_writer *this,
          vector<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_> *container)

{
  bool bVar1;
  reference ppwVar2;
  __normal_iterator<xray_re::wm_slot_*const_*,_std::vector<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  vector<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_> *container_local;
  xr_writer *this_local;
  
  end = std::vector<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>::begin(container);
  local_30._M_current =
       (wm_slot **)
       std::vector<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) break;
    ppwVar2 = __gnu_cxx::
              __normal_iterator<xray_re::wm_slot_*const_*,_std::vector<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>_>
              ::operator*(&end);
    write_wm_slot::operator()((write_wm_slot *)((long)&this_local + 7),*ppwVar2,this);
    __gnu_cxx::
    __normal_iterator<xray_re::wm_slot_*const_*,_std::vector<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}